

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void fill_variance_8x8avg_highbd
               (uint8_t *src_buf,int src_stride,uint8_t *dst_buf,int dst_stride,int x16_idx,
               int y16_idx,VP16x16 *vst,int pixels_wide,int pixels_high)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int dst_avg;
  int src_avg;
  int sum;
  uint sse;
  int y8_idx;
  int x8_idx;
  int idx;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_28;
  
  for (local_28 = 0; (int)local_28 < 4; local_28 = local_28 + 1) {
    iVar1 = in_R8D + (local_28 & 1) * 8;
    iVar2 = in_R9D + ((int)local_28 >> 1) * 8;
    local_34 = 0;
    local_38 = 0;
    if ((iVar1 < sum) && (iVar2 < y8_idx)) {
      uVar3 = aom_highbd_avg_8x8_c((uint8_t *)(in_RDI + iVar2 * in_ESI + (long)iVar1),in_ESI);
      uVar4 = aom_highbd_avg_8x8_c((uint8_t *)(in_RDX + iVar2 * in_ECX + (long)iVar1),in_ECX);
      local_38 = uVar3 - uVar4;
      local_34 = local_38 * local_38;
    }
    fill_variance(local_34,local_38,0,(VPartVar *)(_dst_avg + 0x50 + (long)(int)local_28 * 0x290));
  }
  return;
}

Assistant:

static inline void fill_variance_8x8avg_highbd(
    const uint8_t *src_buf, int src_stride, const uint8_t *dst_buf,
    int dst_stride, int x16_idx, int y16_idx, VP16x16 *vst, int pixels_wide,
    int pixels_high) {
  for (int idx = 0; idx < 4; idx++) {
    const int x8_idx = x16_idx + GET_BLK_IDX_X(idx, 3);
    const int y8_idx = y16_idx + GET_BLK_IDX_Y(idx, 3);
    unsigned int sse = 0;
    int sum = 0;
    if (x8_idx < pixels_wide && y8_idx < pixels_high) {
      int src_avg = aom_highbd_avg_8x8(src_buf + y8_idx * src_stride + x8_idx,
                                       src_stride);
      int dst_avg = aom_highbd_avg_8x8(dst_buf + y8_idx * dst_stride + x8_idx,
                                       dst_stride);

      sum = src_avg - dst_avg;
      sse = sum * sum;
    }
    fill_variance(sse, sum, 0, &vst->split[idx].part_variances.none);
  }
}